

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u32.c
# Opt level: O2

bool_t u32Parity(u32 w)

{
  uint uVar1;
  
  uVar1 = w >> 1 ^ w;
  uVar1 = uVar1 >> 2 ^ uVar1;
  uVar1 = uVar1 >> 4 ^ uVar1;
  uVar1 = uVar1 >> 8 ^ uVar1;
  return (uVar1 >> 0x10 ^ uVar1) & 1;
}

Assistant:

bool_t u32Parity(register u32 w)
{
	w ^= w >> 1;
	w ^= w >> 2;
	w ^= w >> 4;
	w ^= w >> 8;
	w ^= w >> 16;
	return (bool_t)(w & U32_1);
}